

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O0

omittable_field<std::array<int,_2UL>_> * __thiscall
discordpp::omittable_field<std::array<int,_2UL>_>::operator=
          (omittable_field<std::array<int,_2UL>_> *this)

{
  omittable_field<std::array<int,_2UL>_> *this_local;
  
  std::unique_ptr<std::array<int,_2UL>,_std::default_delete<std::array<int,_2UL>_>_>::operator=
            (&(this->super_field<std::array<int,_2UL>_>).t_,(nullptr_t)0x0);
  (this->super_field<std::array<int,_2UL>_>).s_ = omitted_e;
  return this;
}

Assistant:

virtual omittable_field &operator=(omitted_t) {
        field<T>::t_ = nullptr;
        field<T>::s_ = field<T>::omitted_e;
        return *this;
    }